

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenNames_,RefToken *token_,int lower,int upper_,bool matchNot)

{
  int iVar1;
  Token *pTVar2;
  undefined4 in_ECX;
  undefined4 uVar3;
  undefined8 in_RDX;
  BitSet *in_RDI;
  uint in_R8D;
  byte in_R9B;
  string *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  RefCount<Token> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  AST *in_stack_ffffffffffffff48;
  string local_80 [55];
  allocator local_49;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  iVar1 = (int)((ulong)in_RDX >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffb8,"Mismatched Token",&local_49);
  ParserException::ParserException
            ((ParserException *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  (in_RDI->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__MismatchedTokenException_0036ccd0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2989c4);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
             in_stack_ffffffffffffff28);
  RefCount<AST>::RefCount((RefCount<AST> *)(in_RDI + 2),in_stack_ffffffffffffff48);
  std::__cxx11::string::string
            ((string *)
             &in_RDI[2].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset);
  BitSet::BitSet(in_RDI,iVar1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pTVar2 = RefCount<Token>::operator->
                     ((RefCount<Token> *)
                      &in_RDI[1].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
  iVar1 = (*pTVar2->_vptr_Token[1])();
  *(int *)&in_RDI[1].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = iVar1;
  pTVar2 = RefCount<Token>::operator->
                     ((RefCount<Token> *)
                      &in_RDI[1].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
  iVar1 = (**pTVar2->_vptr_Token)();
  *(int *)((long)&in_RDI[1].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = iVar1;
  pTVar2 = RefCount<Token>::operator->
                     ((RefCount<Token> *)
                      &in_RDI[1].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage);
  (*pTVar2->_vptr_Token[2])(local_80);
  std::__cxx11::string::operator=
            ((string *)
             &in_RDI[2].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,local_80);
  std::__cxx11::string::~string(local_80);
  *(undefined4 *)
   ((long)&in_RDI[3].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4) = in_ECX;
  in_RDI[3].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = in_R8D;
  uVar3 = 3;
  if ((in_R9B & 1) != 0) {
    uVar3 = 4;
  }
  *(undefined4 *)
   &in_RDI[3].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p = uVar3;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const std::vector<std::string>& tokenNames_,
	RefToken token_,
	int lower,
	int upper_,
	bool matchNot
) : ParserException("Mismatched Token")
  , token(token_)
  , node(0)
{
	tokenNames = tokenNames_;
	line = token->getLine();
	column = token->getColumn();
	tokenText = token->getText();
	expecting = lower;
	upper = upper_;
	mismatchType = matchNot ? NOT_RANGE : RANGE;
}